

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O2

CommandOptions * write_JP2K_S_file(CommandOptions *Options)

{
  MajorMode_t MVar1;
  AESEncContext *this;
  HMACContext *this_00;
  CommandOptions *in_RSI;
  uint uVar2;
  allocator<char> local_429;
  SequenceParser ParserLeft;
  MXFSWriter Writer;
  SequenceParser ParserRight;
  FortunaRNG RNG;
  allocator<char> local_3c8 [104];
  WriterInfo Info;
  FrameBuffer FrameBuffer;
  byte_t IV_buf [16];
  undefined1 local_270 [104];
  PictureDescriptor PDesc;
  
  ASDCP::JP2K::MXFSWriter::MXFSWriter(&Writer);
  ASDCP::JP2K::FrameBuffer::FrameBuffer(&FrameBuffer,in_RSI->fb_size);
  PDesc.EditRate.Numerator = 0;
  PDesc.EditRate.Denominator = 0;
  PDesc.SampleRate.Numerator = 0;
  PDesc.SampleRate.Denominator = 0;
  PDesc.AspectRatio.Numerator = 0;
  PDesc.AspectRatio.Denominator = 0;
  ASDCP::JP2K::SequenceParser::SequenceParser(&ParserLeft);
  ASDCP::JP2K::SequenceParser::SequenceParser(&ParserRight);
  if (in_RSI->file_count == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&Info,in_RSI->filenames[0],local_3c8);
    ASDCP::JP2K::SequenceParser::OpenRead((string *)Options,SUB81(&ParserLeft,0));
    std::__cxx11::string::~string((string *)&Info);
    if (-1 < (int)Options->mode) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3c8,in_RSI->filenames[1],(allocator<char> *)&RNG);
      ASDCP::JP2K::SequenceParser::OpenRead((string *)&Info,SUB81(&ParserRight,0));
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
      Kumu::Result_t::~Result_t((Result_t *)&Info);
      std::__cxx11::string::~string((string *)local_3c8);
      if (-1 < (int)Options->mode) {
        ASDCP::JP2K::SequenceParser::FillPictureDescriptor((PictureDescriptor *)local_270);
        Kumu::Result_t::~Result_t((Result_t *)local_270);
        PDesc.EditRate = CommandOptions::PictureRate(in_RSI);
        if (in_RSI->verbose_flag == true) {
          fputs("JPEG 2000 stereoscopic pictures\nPictureDescriptor:\n",_stderr);
          fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
          ASDCP::JP2K::PictureDescriptorDump(&PDesc,(_IO_FILE *)0x0);
        }
        if (-1 < (int)Options->mode) {
          if (in_RSI->no_write_flag == false) {
            ASDCP::WriterInfo::WriterInfo(&Info,&s_MyInfo.super_WriterInfo);
            if (in_RSI->asset_id_flag == true) {
              Info.AssetUUID._0_8_ = *(undefined8 *)in_RSI->asset_id_value;
              Info.AssetUUID._8_8_ = *(undefined8 *)(in_RSI->asset_id_value + 8);
            }
            else {
              Kumu::GenRandomUUID(Info.AssetUUID);
            }
            if (in_RSI->use_smpte_labels == true) {
              Info.LabelSetType = LS_MXF_SMPTE;
              fwrite("ATTENTION! Writing SMPTE Universal Labels\n",0x2a,1,_stderr);
            }
            if (in_RSI->key_flag == true) {
              Kumu::FortunaRNG::FortunaRNG(&RNG);
              Kumu::GenRandomUUID(Info.ContextID);
              Info.EncryptedEssence = true;
              if (in_RSI->key_id_flag == true) {
                Info.CryptographicKeyID._0_8_ = *(undefined8 *)in_RSI->key_id_value;
                Info.CryptographicKeyID._8_8_ = *(undefined8 *)(in_RSI->key_id_value + 8);
              }
              else {
                Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(int)&Info + 0x30);
              }
              this = (AESEncContext *)operator_new(8);
              ASDCP::AESEncContext::AESEncContext(this);
              ASDCP::AESEncContext::InitKey((uchar *)local_3c8);
              Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
              Kumu::Result_t::~Result_t((Result_t *)local_3c8);
              if (-1 < (int)Options->mode) {
                Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
                ASDCP::AESEncContext::SetIVec((uchar *)local_3c8);
                Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
                Kumu::Result_t::~Result_t((Result_t *)local_3c8);
                if ((-1 < (int)Options->mode) && (in_RSI->write_hmac == true)) {
                  Info.UsesHMAC = true;
                  this_00 = (HMACContext *)operator_new(8);
                  ASDCP::HMACContext::HMACContext(this_00);
                  ASDCP::HMACContext::InitKey((uchar *)local_3c8,(LabelSet_t)this_00);
                  Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
                  Kumu::Result_t::~Result_t((Result_t *)local_3c8);
                }
              }
              Kumu::FortunaRNG::~FortunaRNG(&RNG);
            }
            if (-1 < (int)Options->mode) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&RNG,in_RSI->out_file,&local_429);
              ASDCP::JP2K::MXFSWriter::OpenWrite
                        ((string *)local_3c8,(WriterInfo *)&Writer,(PictureDescriptor *)&RNG,
                         (uint)&Info);
              Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3c8);
              Kumu::Result_t::~Result_t((Result_t *)local_3c8);
              std::__cxx11::string::~string((string *)&RNG);
            }
            ASDCP::WriterInfo::~WriterInfo(&Info);
            if ((int)Options->mode < 0) goto LAB_0010c57e;
          }
          ASDCP::JP2K::SequenceParser::Reset();
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
          Kumu::Result_t::~Result_t((Result_t *)&Info);
          MVar1 = Options->mode;
          if (-1 < (int)MVar1) {
            ASDCP::JP2K::SequenceParser::Reset();
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
            Kumu::Result_t::~Result_t((Result_t *)&Info);
            MVar1 = Options->mode;
          }
          for (uVar2 = 0; (-1 < (int)MVar1 && (uVar2 < in_RSI->duration)); uVar2 = uVar2 + 1) {
            ASDCP::JP2K::SequenceParser::ReadFrame((FrameBuffer *)&Info);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
            Kumu::Result_t::~Result_t((Result_t *)&Info);
            MVar1 = Options->mode;
            if (-1 < (int)MVar1) {
              if (in_RSI->verbose_flag == true) {
                ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
              }
              if (in_RSI->encrypt_header_flag == true) {
                FrameBuffer._36_4_ = 0;
              }
              MVar1 = Options->mode;
              if (-1 < (int)MVar1) {
                if (in_RSI->no_write_flag == false) {
                  ASDCP::JP2K::MXFSWriter::WriteFrame
                            ((FrameBuffer *)&Info,(StereoscopicPhase_t)&Writer,
                             (AESEncContext *)&FrameBuffer,(HMACContext *)0x0);
                  Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
                  Kumu::Result_t::~Result_t((Result_t *)&Info);
                  MVar1 = Options->mode;
                  if ((int)MVar1 < 0) goto LAB_0010c523;
                }
                ASDCP::JP2K::SequenceParser::ReadFrame((FrameBuffer *)&Info);
                Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
                Kumu::Result_t::~Result_t((Result_t *)&Info);
                MVar1 = Options->mode;
                if (-1 < (int)MVar1) {
                  if (in_RSI->verbose_flag == true) {
                    ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
                  }
                  if (in_RSI->encrypt_header_flag == true) {
                    FrameBuffer._36_4_ = 0;
                  }
                  MVar1 = Options->mode;
                  if ((-1 < (int)MVar1) && (in_RSI->no_write_flag == false)) {
                    ASDCP::JP2K::MXFSWriter::WriteFrame
                              ((FrameBuffer *)&Info,(StereoscopicPhase_t)&Writer,
                               (AESEncContext *)&FrameBuffer,(HMACContext *)0x1);
                    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
                    Kumu::Result_t::~Result_t((Result_t *)&Info);
                    MVar1 = Options->mode;
                  }
                }
              }
            }
LAB_0010c523:
          }
          if (MVar1 == Kumu::RESULT_ENDOFFILE) {
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
            MVar1 = Options->mode;
          }
          if ((-1 < (int)MVar1) && (in_RSI->no_write_flag == false)) {
            ASDCP::JP2K::MXFSWriter::Finalize();
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&Info);
            Kumu::Result_t::~Result_t((Result_t *)&Info);
          }
        }
      }
    }
  }
  else {
    fwrite("Two inputs are required for stereoscopic option.\n",0x31,1,_stderr);
    Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
  }
LAB_0010c57e:
  ASDCP::JP2K::SequenceParser::~SequenceParser(&ParserRight);
  ASDCP::JP2K::SequenceParser::~SequenceParser(&ParserLeft);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  ASDCP::JP2K::MXFSWriter::~MXFSWriter(&Writer);
  return Options;
}

Assistant:

Result_t
write_JP2K_S_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  JP2K::MXFSWriter        Writer;
  JP2K::FrameBuffer       FrameBuffer(Options.fb_size);
  JP2K::PictureDescriptor PDesc;
  JP2K::SequenceParser    ParserLeft, ParserRight;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  if ( Options.file_count != 2 )
    {
      fprintf(stderr, "Two inputs are required for stereoscopic option.\n");
      return RESULT_FAIL;
    }

  // set up essence parser
  Result_t result = ParserLeft.OpenRead(Options.filenames[0], Options.j2c_pedantic);

  if ( ASDCP_SUCCESS(result) )
    result = ParserRight.OpenRead(Options.filenames[1], Options.j2c_pedantic);

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      ParserLeft.FillPictureDescriptor(PDesc);
      PDesc.EditRate = Options.PictureRate();

      if ( Options.verbose_flag )
	{
	  fputs("JPEG 2000 stereoscopic pictures\nPictureDescriptor:\n", stderr);
          fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  JP2K::PictureDescriptorDump(PDesc);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

      if ( Options.use_smpte_labels )
	{
	  Info.LabelSetType = LS_MXF_SMPTE;
	  fprintf(stderr, "ATTENTION! Writing SMPTE Universal Labels\n");
	}

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
          Kumu::FortunaRNG RNG;

	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	  else
	    RNG.FillRandom(Info.CryptographicKeyID, UUIDlen);

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	result = Writer.OpenWrite(Options.out_file, Info, PDesc);
    }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t duration = 0;
      result = ParserLeft.Reset();
      if ( ASDCP_SUCCESS(result) ) result = ParserRight.Reset();

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = ParserLeft.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
		  
	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    result = Writer.WriteFrame(FrameBuffer, JP2K::SP_LEFT, Context, HMAC);

	  if ( ASDCP_SUCCESS(result) )
	    result = ParserRight.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
		  
	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    result = Writer.WriteFrame(FrameBuffer, JP2K::SP_RIGHT, Context, HMAC);
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}